

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O0

__pid_t __thiscall Signal::wait(Signal *this,void *__stat_loc)

{
  code *pcVar1;
  int iVar2;
  Signal *this_local;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->mdata);
  if ((iVar2 != 0) &&
     (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                            ,0x3f,"pthread_mutex_lock((pthread_mutex_t*)mdata) == 0"), iVar2 != 0))
  {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  while ((this->signaled & 1U) == 0) {
    iVar2 = pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)this->mdata);
    if ((iVar2 != 0) &&
       (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                              ,0x47,
                              "pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0"
                             ), iVar2 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->mdata);
  if ((iVar2 != 0) &&
     (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Signal.cpp"
                            ,0x44,"pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0"), iVar2 != 0)
     ) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return (__pid_t)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
}

Assistant:

bool Signal::wait()
{
#ifdef _WIN32
  return WaitForSingleObject(handle, INFINITE) == WAIT_OBJECT_0;
#else
  VERIFY(pthread_mutex_lock((pthread_mutex_t*)mdata) == 0);
  for(;;)
  {
    if(signaled)
    {
      VERIFY(pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0);
      return true;
    }
    VERIFY(pthread_cond_wait((pthread_cond_t*)cdata, (pthread_mutex_t*)mdata) == 0);
  }
#endif
}